

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

void FT_Outline_Translate(FT_Outline *outline,FT_Pos xOffset,FT_Pos yOffset)

{
  FT_Vector *local_30;
  FT_Vector *vec;
  FT_UShort n;
  FT_Pos yOffset_local;
  FT_Pos xOffset_local;
  FT_Outline *outline_local;
  
  if (outline != (FT_Outline *)0x0) {
    local_30 = outline->points;
    for (vec._6_2_ = 0; (int)(uint)vec._6_2_ < (int)outline->n_points; vec._6_2_ = vec._6_2_ + 1) {
      local_30->x = local_30->x + xOffset;
      local_30->y = local_30->y + yOffset;
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Outline_Translate( const FT_Outline*  outline,
                        FT_Pos             xOffset,
                        FT_Pos             yOffset )
  {
    FT_UShort   n;
    FT_Vector*  vec;


    if ( !outline )
      return;

    vec = outline->points;

    for ( n = 0; n < outline->n_points; n++ )
    {
      vec->x = ADD_LONG( vec->x, xOffset );
      vec->y = ADD_LONG( vec->y, yOffset );
      vec++;
    }
  }